

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

void vera::setMousePosition(float _x,float _y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  _ZL5mouse_4 = 0;
  _ZL5mouse_5 = 0;
  fVar2 = (float)(int)((float)viewport.field_3.w * fPixelDensity);
  fVar3 = 0.0;
  if (0.0 <= _y) {
    fVar3 = _y;
  }
  fVar1 = fVar2;
  if (fVar3 <= fVar2) {
    fVar1 = fVar3;
  }
  _ZL5mouse_1 = _x;
  _ZL5mouse_2 = _y;
  _ZL5mouse_6 = _x;
  _ZL5mouse_7 = _y;
  glfwSetCursorPos(window,(double)(_x / fPixelDensity),(double)((fVar2 - fVar1) / fPixelDensity));
  return;
}

Assistant:

void    setMousePosition( float _x, float _y ) {
    mouse.x = _x;
    mouse.y = _y;
    mouse.velX = 0.0f;
    mouse.velY = 0.0f;
    mouse.drag.x = _x;
    mouse.drag.y = _y;
    #if defined(DRIVER_GLFW)
    float h = getWindowHeight();
    float y = h - glm::clamp(_y, 0.0f, h);
    glfwSetCursorPos(window, _x / fPixelDensity , y / fPixelDensity);
    #endif
}